

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_state_callback_remove(callback_type_e c_type,_func_void_void_ptr *func,void *arg)

{
  fio_ls_embd_s *node;
  callback_collection_s *lock;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK)) {
    lock = callback_collection + c_type;
    fio_lock(&lock->lock);
    node = &callback_collection[c_type].callbacks;
    while (node = node->next, node != &callback_collection[c_type].callbacks) {
      if ((node[1].prev == (fio_ls_embd_s *)func) && (node[1].next == (fio_ls_embd_s *)arg)) {
        fio_ls_embd_remove(node);
        free(node);
        LOCK();
        lock->lock = '\0';
        UNLOCK();
        return 0;
      }
    }
    LOCK();
    lock->lock = '\0';
    UNLOCK();
  }
  return -1;
}

Assistant:

int fio_state_callback_remove(callback_type_e c_type, void (*func)(void *),
                              void *arg) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return -1;
  fio_lock(&callback_collection[c_type].lock);
  FIO_LS_EMBD_FOR(&callback_collection[c_type].callbacks, pos) {
    callback_data_s *tmp = (FIO_LS_EMBD_OBJ(callback_data_s, node, pos));
    if (tmp->func == func && tmp->arg == arg) {
      fio_ls_embd_remove(&tmp->node);
      free(tmp);
      goto success;
    }
  }
  fio_unlock(&callback_collection[c_type].lock);
  return -1;
success:
  fio_unlock(&callback_collection[c_type].lock);
  return -0;
}